

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderBase.hpp
# Opt level: O3

void __thiscall
Diligent::ShaderBase<Diligent::EngineVkImplTraits>::ShaderBase
          (ShaderBase<Diligent::EngineVkImplTraits> *this,IReferenceCounters *pRefCounters,
          RenderDeviceImplType *pDevice,ShaderDesc *Desc,RenderDeviceInfo *DeviceInfo,
          GraphicsAdapterInfo *AdapterInfo,bool bIsDeviceInternal)

{
  SHADER_TYPE SVar1;
  char *pcVar2;
  allocator local_21;
  
  DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>::
  DeviceObjectBase(&this->
                    super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
                   ,pRefCounters,pDevice,Desc,bIsDeviceInternal);
  (this->
  super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>).
  super_ObjectBase<Diligent::IShaderVk>.super_RefCountedObject<Diligent::IShaderVk>.super_IShaderVk.
  super_IShader.super_IDeviceObject.super_IObject = (IObject)&PTR_QueryInterface_00aedd78;
  (this->m_AsyncInitializer)._M_t.
  super___uniq_ptr_impl<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
  ._M_t.
  super__Tuple_impl<0UL,_Diligent::AsyncInitializer_*,_std::default_delete<Diligent::AsyncInitializer>_>
  .super__Head_base<0UL,_Diligent::AsyncInitializer_*,_false>._M_head_impl = (AsyncInitializer *)0x0
  ;
  pcVar2 = "_sampler";
  if (Desc->CombinedSamplerSuffix != (Char *)0x0) {
    pcVar2 = Desc->CombinedSamplerSuffix;
  }
  std::__cxx11::string::string((string *)&this->m_CombinedSamplerSuffix,pcVar2,&local_21);
  (this->m_Status)._M_i = SHADER_STATUS_UNINITIALIZED;
  (this->
  super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>).
  m_Desc.CombinedSamplerSuffix = (this->m_CombinedSamplerSuffix)._M_dataplus._M_p;
  SVar1 = Desc->ShaderType;
  if ((SVar1 == SHADER_TYPE_GEOMETRY) &&
     ((DeviceInfo->Features).GeometryShaders == DEVICE_FEATURE_STATE_DISABLED)) {
    LogError<true,char[51]>
              (false,"ShaderBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBase.hpp"
               ,0x81,(char (*) [51])"Geometry shaders are not supported by this device.");
    SVar1 = Desc->ShaderType;
  }
  if ((SVar1 == SHADER_TYPE_DOMAIN) || (SVar1 == SHADER_TYPE_HULL)) {
    if ((DeviceInfo->Features).Tessellation != DEVICE_FEATURE_STATE_DISABLED) goto LAB_002287bc;
    LogError<true,char[55]>
              (false,"ShaderBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBase.hpp"
               ,0x84,(char (*) [55])"Tessellation shaders are not supported by this device.");
    SVar1 = Desc->ShaderType;
  }
  if ((SVar1 == SHADER_TYPE_COMPUTE) &&
     ((DeviceInfo->Features).ComputeShaders == DEVICE_FEATURE_STATE_DISABLED)) {
    LogError<true,char[50]>
              (false,"ShaderBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBase.hpp"
               ,0x87,(char (*) [50])"Compute shaders are not supported by this device.");
    SVar1 = Desc->ShaderType;
  }
LAB_002287bc:
  if (((SVar1 == SHADER_TYPE_MESH) || (SVar1 == SHADER_TYPE_AMPLIFICATION)) &&
     ((DeviceInfo->Features).MeshShaders == DEVICE_FEATURE_STATE_DISABLED)) {
    LogError<true,char[47]>
              (false,"ShaderBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBase.hpp"
               ,0x8a,(char (*) [47])"Mesh shaders are not supported by this device.");
    SVar1 = Desc->ShaderType;
  }
  if (((SVar1 & SHADER_TYPE_ALL_RAY_TRACING) != SHADER_TYPE_UNKNOWN) &&
     (((DeviceInfo->Features).RayTracing == DEVICE_FEATURE_STATE_DISABLED ||
      (((AdapterInfo->RayTracing).CapFlags & RAY_TRACING_CAP_FLAG_STANDALONE_SHADERS) ==
       RAY_TRACING_CAP_FLAG_NONE)))) {
    LogError<true,char[65]>
              (false,"ShaderBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBase.hpp"
               ,0x90,(char (*) [65])
                     "Standalone ray tracing shaders are not supported by this device.");
    SVar1 = Desc->ShaderType;
  }
  if ((SVar1 == SHADER_TYPE_LAST) &&
     ((DeviceInfo->Features).TileShaders == DEVICE_FEATURE_STATE_DISABLED)) {
    LogError<true,char[47]>
              (false,"ShaderBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBase.hpp"
               ,0x94,(char (*) [47])"Tile shaders are not supported by this device.");
  }
  return;
}

Assistant:

ShaderBase(IReferenceCounters*        pRefCounters,
               RenderDeviceImplType*      pDevice,
               const ShaderDesc&          Desc,
               const RenderDeviceInfo&    DeviceInfo,
               const GraphicsAdapterInfo& AdapterInfo,
               bool                       bIsDeviceInternal = false) :
        TDeviceObjectBase{pRefCounters, pDevice, Desc, bIsDeviceInternal},
        m_CombinedSamplerSuffix{Desc.CombinedSamplerSuffix != nullptr ? Desc.CombinedSamplerSuffix : ShaderDesc{}.CombinedSamplerSuffix}
    {
        this->m_Desc.CombinedSamplerSuffix = m_CombinedSamplerSuffix.c_str();

        const DeviceFeatures& deviceFeatures = DeviceInfo.Features;
        if (Desc.ShaderType == SHADER_TYPE_GEOMETRY && !deviceFeatures.GeometryShaders)
            LOG_ERROR_AND_THROW("Geometry shaders are not supported by this device.");

        if ((Desc.ShaderType == SHADER_TYPE_DOMAIN || Desc.ShaderType == SHADER_TYPE_HULL) && !deviceFeatures.Tessellation)
            LOG_ERROR_AND_THROW("Tessellation shaders are not supported by this device.");

        if (Desc.ShaderType == SHADER_TYPE_COMPUTE && !deviceFeatures.ComputeShaders)
            LOG_ERROR_AND_THROW("Compute shaders are not supported by this device.");

        if ((Desc.ShaderType == SHADER_TYPE_AMPLIFICATION || Desc.ShaderType == SHADER_TYPE_MESH) && !deviceFeatures.MeshShaders)
            LOG_ERROR_AND_THROW("Mesh shaders are not supported by this device.");

        if ((Desc.ShaderType & SHADER_TYPE_ALL_RAY_TRACING) != 0)
        {
            const RAY_TRACING_CAP_FLAGS RTCaps = AdapterInfo.RayTracing.CapFlags;
            if (!deviceFeatures.RayTracing || (RTCaps & RAY_TRACING_CAP_FLAG_STANDALONE_SHADERS) == 0)
                LOG_ERROR_AND_THROW("Standalone ray tracing shaders are not supported by this device.");
        }

        if (Desc.ShaderType == SHADER_TYPE_TILE && !deviceFeatures.TileShaders)
            LOG_ERROR_AND_THROW("Tile shaders are not supported by this device.");
    }